

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateMapGetters
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  string_view end_varname_05;
  string_view end_varname_06;
  string_view end_varname_07;
  string_view end_varname_08;
  string_view end_varname_09;
  Printer *pPVar3;
  bool bVar4;
  JavaType JVar5;
  Options *pOVar6;
  undefined1 uVar7;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_6c8;
  string_view local_6c0;
  string_view local_6b0;
  string_view local_6a0;
  FieldDescriptor local_690;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_638;
  basic_string_view<char,_std::char_traits<char>_> local_630;
  string_view local_620;
  string_view local_610;
  FieldDescriptor local_600;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_5a8;
  basic_string_view<char,_std::char_traits<char>_> local_5a0;
  string_view local_590;
  string_view local_580;
  FieldDescriptor local_570;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_518;
  basic_string_view<char,_std::char_traits<char>_> local_510;
  string_view local_500;
  string_view local_4f0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_4d8;
  string_view local_4d0;
  string_view local_4c0;
  string_view local_4b0;
  FieldDescriptor local_4a0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_448;
  basic_string_view<char,_std::char_traits<char>_> local_440;
  string_view local_430;
  string_view local_420;
  FieldDescriptor local_410;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_3b8;
  basic_string_view<char,_std::char_traits<char>_> local_3b0;
  string_view local_3a0;
  string_view local_390;
  FieldDescriptor local_380;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_328;
  basic_string_view<char,_std::char_traits<char>_> local_320;
  string_view local_310;
  string_view local_300;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_2e8;
  string_view local_2e0;
  string_view local_2d0;
  string_view local_2c0;
  FieldDescriptor local_2b0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_258;
  basic_string_view<char,_std::char_traits<char>_> local_250;
  string_view local_240;
  string_view local_230;
  FieldDescriptor local_220;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  string_view local_1b0;
  string_view local_1a0;
  FieldDescriptor local_190;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_138;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  string_view local_120;
  string_view local_110;
  FieldDescriptor *local_100;
  FieldDescriptor *value;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  string_view local_d8;
  string_view local_c8 [2];
  FieldDescriptor local_a8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMapFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return internalGet$capitalized_name$().getMap().size();\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_28);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_50);
  end_varname_09._M_str = local_48._M_str;
  end_varname_09._M_len = local_48._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_38,end_varname_09,pFVar1,local_50);
  pPVar3 = local_18;
  uVar7 = SUB81(local_48._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar6 = Context::options(this->context_);
  java::Options::Options((Options *)&local_a8,pOVar6);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_a8,(Options *)0x0,(bool)uVar7);
  java::Options::~Options((Options *)&local_a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_c8,
             "@java.lang.Override\n$deprecation$public boolean ${$contains$capitalized_name$$}$(\n    $key_type$ key) {\n  $key_null_check$\n  return internalGet$capitalized_name$().getMap().containsKey(key);\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_c8[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_f0);
  end_varname_08._M_str = local_e8._M_str;
  end_varname_08._M_len = local_e8._M_len;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_d8,end_varname_08,pFVar1,local_f0);
  uVar7 = SUB81(local_e8._M_str,0);
  local_100 = MapValueField(this->descriptor_);
  JVar5 = GetJavaType(local_100);
  if (JVar5 == JAVATYPE_ENUM) {
    pOVar6 = Context::options(this->context_);
    pPVar2 = local_18;
    if ((pOVar6->opensource_runtime & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_110,
                 "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Override\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$$}$() {\n  return get$capitalized_name$Map();\n}\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_110);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_120,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_138);
      end_varname_07._M_str = local_130._M_str;
      end_varname_07._M_len = local_130._M_len;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_120,end_varname_07,pFVar1,local_138);
      uVar7 = SUB81(local_130._M_str,0);
    }
    pPVar3 = local_18;
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    java::Options::Options((Options *)&local_190,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_190,(Options *)0x0,(bool)uVar7);
    java::Options::~Options((Options *)&local_190);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1a0,
               "@java.lang.Override\n$deprecation$public java.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$Map$}$() {\n  return internalGetAdapted$capitalized_name$Map(\n      internalGet$capitalized_name$().getMap());}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_1a0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b0,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1c8);
    end_varname_06._M_str = local_1c0._M_str;
    end_varname_06._M_len = local_1c0._M_len;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_1b0,end_varname_06,pFVar1,local_1c8);
    pPVar3 = local_18;
    uVar7 = SUB81(local_1c0._M_str,0);
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    java::Options::Options((Options *)&local_220,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_220,(Options *)0x0,(bool)uVar7);
    java::Options::~Options((Options *)&local_220);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_230,
               "@java.lang.Override\n$deprecation$public $value_enum_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_enum_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  return map.containsKey(key)\n         ? $name$ValueConverter.doForward(map.get(key))\n         : defaultValue;\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_230);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_240,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_250,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_258);
    end_varname_05._M_str = local_250._M_str;
    end_varname_05._M_len = local_250._M_len;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_240,end_varname_05,pFVar1,local_258);
    pPVar3 = local_18;
    uVar7 = SUB81(local_250._M_str,0);
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    java::Options::Options((Options *)&local_2b0,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_2b0,(Options *)0x0,(bool)uVar7);
    java::Options::~Options((Options *)&local_2b0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2c0,
               "@java.lang.Override\n$deprecation$public $value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return $name$ValueConverter.doForward(map.get(key));\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_2c0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d0,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e0,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_2e8);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_2d0,local_2e0,pFVar1,local_2e8);
    bVar4 = SupportUnknownEnumValue(local_100);
    pPVar2 = local_18;
    if (bVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_300,
                 "/**\n * Use {@link #get$capitalized_name$ValueMap()} instead.\n */\n@java.lang.Override\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $boxed_value_type$>\n${$get$capitalized_name$Value$}$() {\n  return get$capitalized_name$ValueMap();\n}\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_300);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_310,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_320,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_328);
      end_varname_04._M_str = local_320._M_str;
      end_varname_04._M_len = local_320._M_len;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_310,end_varname_04,pFVar1,local_328);
      pPVar3 = local_18;
      uVar7 = SUB81(local_320._M_str,0);
      pPVar2 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      java::Options::Options((Options *)&local_380,pOVar6);
      WriteFieldDocComment((java *)pPVar3,pPVar2,&local_380,(Options *)0x0,(bool)uVar7);
      java::Options::~Options((Options *)&local_380);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_390,
                 "@java.lang.Override\n$deprecation$public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n${$get$capitalized_name$ValueMap$}$() {\n  return internalGet$capitalized_name$().getMap();\n}\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_390);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3a0,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b0,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_3b8);
      end_varname_03._M_str = local_3b0._M_str;
      end_varname_03._M_len = local_3b0._M_len;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_3a0,end_varname_03,pFVar1,local_3b8);
      pPVar3 = local_18;
      uVar7 = SUB81(local_3b0._M_str,0);
      pPVar2 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      java::Options::Options((Options *)&local_410,pOVar6);
      WriteFieldDocComment((java *)pPVar3,pPVar2,&local_410,(Options *)0x0,(bool)uVar7);
      java::Options::~Options((Options *)&local_410);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_420,
                 "@java.lang.Override\n$deprecation$public $value_type_pass_through_nullness$ ${$get$capitalized_name$ValueOrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  return map.containsKey(key) ? map.get(key) : defaultValue;\n}\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_420);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_430,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_440,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_448);
      end_varname_02._M_str = local_440._M_str;
      end_varname_02._M_len = local_440._M_len;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_430,end_varname_02,pFVar1,local_448);
      pPVar3 = local_18;
      uVar7 = SUB81(local_440._M_str,0);
      pPVar2 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      java::Options::Options((Options *)&local_4a0,pOVar6);
      WriteFieldDocComment((java *)pPVar3,pPVar2,&local_4a0,(Options *)0x0,(bool)uVar7);
      java::Options::~Options((Options *)&local_4a0);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_4b0,
                 "@java.lang.Override\n$deprecation$public $value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$().getMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return map.get(key);\n}\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_4b0);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4c0,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4d0,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_4d8);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_4c0,local_4d0,pFVar1,local_4d8);
    }
  }
  else {
    pOVar6 = Context::options(this->context_);
    pPVar2 = local_18;
    if ((pOVar6->opensource_runtime & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_4f0,
                 "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Override\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$> ${$get$capitalized_name$$}$() {\n  return get$capitalized_name$Map();\n}\n"
                );
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_4f0);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_500,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_510,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_518);
      end_varname_01._M_str = local_510._M_str;
      end_varname_01._M_len = local_510._M_len;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_500,end_varname_01,pFVar1,local_518);
      uVar7 = SUB81(local_510._M_str,0);
    }
    pPVar3 = local_18;
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    java::Options::Options((Options *)&local_570,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_570,(Options *)0x0,(bool)uVar7);
    java::Options::~Options((Options *)&local_570);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_580,
               "@java.lang.Override\n$deprecation$public java.util.Map<$type_parameters$> ${$get$capitalized_name$Map$}$() {\n  return internalGet$capitalized_name$().getMap();\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_580);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_590,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5a0,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_5a8);
    end_varname_00._M_str = local_5a0._M_str;
    end_varname_00._M_len = local_5a0._M_len;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_590,end_varname_00,pFVar1,local_5a8);
    pPVar3 = local_18;
    uVar7 = SUB81(local_5a0._M_str,0);
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    java::Options::Options((Options *)&local_600,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_600,(Options *)0x0,(bool)uVar7);
    java::Options::~Options((Options *)&local_600);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_610,
               "@java.lang.Override\n$deprecation$public $value_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$type_parameters$> map =\n      internalGet$capitalized_name$().getMap();\n  return map.containsKey(key) ? map.get(key) : defaultValue;\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_610);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_620,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_630,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_638);
    end_varname._M_str = local_630._M_str;
    end_varname._M_len = local_630._M_len;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_620,end_varname,pFVar1,local_638);
    pPVar3 = local_18;
    uVar7 = SUB81(local_630._M_str,0);
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    java::Options::Options((Options *)&local_690,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_690,(Options *)0x0,(bool)uVar7);
    java::Options::~Options((Options *)&local_690);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_6a0,
               "@java.lang.Override\n$deprecation$public $value_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$type_parameters$> map =\n      internalGet$capitalized_name$().getMap();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return map.get(key);\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_6a0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6b0,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6c0,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_6c8);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_6b0,local_6c0,pFVar1,local_6c8);
  }
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateMapGetters(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return internalGet$capitalized_name$().getMap().size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public boolean ${$contains$capitalized_name$$}$(\n"
      "    $key_type$ key) {\n"
      "  $key_null_check$\n"
      "  return internalGet$capitalized_name$().getMap().containsKey(key);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  const FieldDescriptor* value = MapValueField(descriptor_);
  if (GetJavaType(value) == JAVATYPE_ENUM) {
    if (context_->options().opensource_runtime) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$Map()} instead.\n"
          " */\n"
          "@java.lang.Override\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
          "${$get$capitalized_name$$}$() {\n"
          "  return get$capitalized_name$Map();\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
    }

    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public java.util.Map<$boxed_key_type$, "
                   "$value_enum_type$>\n"
                   "${$get$capitalized_name$Map$}$() {\n"
                   "  return internalGetAdapted$capitalized_name$Map(\n"
                   "      internalGet$capitalized_name$().getMap());"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);

    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public $value_enum_type_pass_through_nullness$ "
        "${$get$capitalized_name$OrDefault$}$(\n"
        "    $key_type$ key,\n"
        "    $value_enum_type_pass_through_nullness$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  return map.containsKey(key)\n"
        "         ? $name$ValueConverter.doForward(map.get(key))\n"
        "         : defaultValue;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);

    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public $value_enum_type$ "
        "${$get$capitalized_name$OrThrow$}$(\n"
        "    $key_type$ key) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  if (!map.containsKey(key)) {\n"
        "    throw new java.lang.IllegalArgumentException();\n"
        "  }\n"
        "  return $name$ValueConverter.doForward(map.get(key));\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);

    if (SupportUnknownEnumValue(value)) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$ValueMap()} instead.\n"
          " */\n"
          "@java.lang.Override\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "${$get$capitalized_name$Value$}$() {\n"
          "  return get$capitalized_name$ValueMap();\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(variables_,
                     "@java.lang.Override\n"
                     "$deprecation$public java.util.Map<$boxed_key_type$, "
                     "$boxed_value_type$>\n"
                     "${$get$capitalized_name$ValueMap$}$() {\n"
                     "  return internalGet$capitalized_name$().getMap();\n"
                     "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(
          variables_,
          "@java.lang.Override\n"
          "$deprecation$public $value_type_pass_through_nullness$ "
          "${$get$capitalized_name$ValueOrDefault$}$(\n"
          "    $key_type$ key,\n"
          "    $value_type_pass_through_nullness$ defaultValue) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$().getMap();\n"
          "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(
          variables_,
          "@java.lang.Override\n"
          "$deprecation$public $value_type$ "
          "${$get$capitalized_name$ValueOrThrow$}$(\n"
          "    $key_type$ key) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$().getMap();\n"
          "  if (!map.containsKey(key)) {\n"
          "    throw new java.lang.IllegalArgumentException();\n"
          "  }\n"
          "  return map.get(key);\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
    }
  } else {
    if (context_->options().opensource_runtime) {
      printer->Print(variables_,
                     "/**\n"
                     " * Use {@link #get$capitalized_name$Map()} instead.\n"
                     " */\n"
                     "@java.lang.Override\n"
                     "@java.lang.Deprecated\n"
                     "public java.util.Map<$type_parameters$> "
                     "${$get$capitalized_name$$}$() {\n"
                     "  return get$capitalized_name$Map();\n"
                     "}\n");
      printer->Annotate("{", "}", descriptor_);
    }
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public java.util.Map<$type_parameters$> "
                   "${$get$capitalized_name$Map$}$() {\n"
                   "  return internalGet$capitalized_name$().getMap();\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public $value_type_pass_through_nullness$ "
        "${$get$capitalized_name$OrDefault$}$(\n"
        "    $key_type$ key,\n"
        "    $value_type_pass_through_nullness$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$type_parameters$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public $value_type$ ${$get$capitalized_name$OrThrow$}$(\n"
        "    $key_type$ key) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$type_parameters$> map =\n"
        "      internalGet$capitalized_name$().getMap();\n"
        "  if (!map.containsKey(key)) {\n"
        "    throw new java.lang.IllegalArgumentException();\n"
        "  }\n"
        "  return map.get(key);\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
}